

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

bool __thiscall t_php_generator::php_is_scalar(t_php_generator *this,t_type *ttype)

{
  int iVar1;
  t_type *ptVar2;
  
  ptVar2 = t_type::get_true_type(ttype);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 != '\0') {
    return true;
  }
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
  return SUB41(iVar1,0);
}

Assistant:

bool php_is_scalar(t_type *ttype) {
    ttype = ttype->get_true_type();
    if(ttype->is_base_type()) {
      return true;
    } else if(ttype->is_enum()) {
      return true;
    } else {
      return false;
    }
  }